

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode cf_he_query(Curl_cfilter *cf,Curl_easy *data,int query,int *pres1,void *pres2)

{
  int iVar1;
  curltime cVar2;
  CURLcode local_ac;
  undefined4 uStack_84;
  curltime *when_1;
  undefined4 uStack_6c;
  curltime *when;
  long lStack_58;
  int breply_ms;
  eyeballer *baller;
  size_t i;
  void *pvStack_40;
  int reply_ms;
  cf_he_ctx *ctx;
  void *pres2_local;
  int *pres1_local;
  Curl_easy *pCStack_20;
  int query_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  pvStack_40 = cf->ctx;
  ctx = (cf_he_ctx *)pres2;
  pres2_local = pres1;
  pres1_local._4_4_ = query;
  pCStack_20 = data;
  data_local = (Curl_easy *)cf;
  if ((cf->field_0x24 & 1) == 0) {
    if (query == 2) {
      i._4_4_ = -1;
      pres1_local._4_4_ = 2;
      for (baller = (eyeballer *)0x0; baller < (eyeballer *)0x2;
          baller = (eyeballer *)((long)&baller->name + 1)) {
        lStack_58 = *(long *)((long)pvStack_40 + (long)baller * 8 + 0x20);
        if (((((lStack_58 != 0) && (*(long *)(lStack_58 + 0x28) != 0)) &&
             (iVar1 = (**(code **)(**(long **)(lStack_58 + 0x28) + 0x68))
                                (*(undefined8 *)(lStack_58 + 0x28),pCStack_20,pres1_local._4_4_,
                                 (long)&when + 4,0), iVar1 == 0)) && (-1 < when._4_4_)) &&
           ((i._4_4_ < 0 || (when._4_4_ < i._4_4_)))) {
          i._4_4_ = when._4_4_;
        }
      }
      *(int *)pres2_local = i._4_4_;
      if (((pCStack_20 != (Curl_easy *)0x0) &&
          ((*(ulong *)&(pCStack_20->set).field_0x8ba >> 0x1c & 1) != 0)) &&
         ((data_local != (Curl_easy *)0x0 && (0 < *(int *)(*(long *)data_local + 0xc))))) {
        Curl_trc_cf_infof(pCStack_20,(Curl_cfilter *)data_local,"query connect reply: %dms",
                          (ulong)*pres2_local);
      }
      return CURLE_OK;
    }
    if (query == 4) {
      cVar2 = get_max_baller_time(cf,data,4);
      *(time_t *)pres2 = cVar2.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_6c,cVar2.tv_usec);
      return CURLE_OK;
    }
    if (query == 5) {
      cVar2 = get_max_baller_time(cf,data,5);
      *(time_t *)pres2 = cVar2.tv_sec;
      *(ulong *)((long)pres2 + 8) = CONCAT44(uStack_84,cVar2.tv_usec);
      return CURLE_OK;
    }
  }
  if (cf->next == (Curl_cfilter *)0x0) {
    local_ac = CURLE_UNKNOWN_OPTION;
  }
  else {
    local_ac = (*cf->next->cft->query)(cf->next,data,query,pres1,pres2);
  }
  return local_ac;
}

Assistant:

static CURLcode cf_he_query(struct Curl_cfilter *cf,
                            struct Curl_easy *data,
                            int query, int *pres1, void *pres2)
{
  struct cf_he_ctx *ctx = cf->ctx;

  if(!cf->connected) {
    switch(query) {
    case CF_QUERY_CONNECT_REPLY_MS: {
      int reply_ms = -1;
      size_t i;

      for(i = 0; i < ARRAYSIZE(ctx->baller); i++) {
        struct eyeballer *baller = ctx->baller[i];
        int breply_ms;

        if(baller && baller->cf &&
           !baller->cf->cft->query(baller->cf, data, query,
                                   &breply_ms, NULL)) {
          if(breply_ms >= 0 && (reply_ms < 0 || breply_ms < reply_ms))
            reply_ms = breply_ms;
        }
      }
      *pres1 = reply_ms;
      CURL_TRC_CF(data, cf, "query connect reply: %dms", *pres1);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_CONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_CONNECT);
      return CURLE_OK;
    }
    case CF_QUERY_TIMER_APPCONNECT: {
      struct curltime *when = pres2;
      *when = get_max_baller_time(cf, data, CF_QUERY_TIMER_APPCONNECT);
      return CURLE_OK;
    }
    default:
      break;
    }
  }

  return cf->next?
    cf->next->cft->query(cf->next, data, query, pres1, pres2) :
    CURLE_UNKNOWN_OPTION;
}